

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::mousePressEvent(QTreeView *this,QMouseEvent *event)

{
  QTreeViewPrivate *this_00;
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QPointF QVar4;
  qreal local_40;
  qreal local_38;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_30;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar3 = QWidget::style((QWidget *)this);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x28,0,this,0);
  if (iVar2 == 2) {
    QVar4 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_38 = QVar4.yp;
    local_40 = QVar4.xp;
    local_28 = QPointF::toPoint((QPointF *)&local_40);
    bVar1 = QTreeViewPrivate::expandOrCollapseItemAtPos(this_00,&local_28);
    if (!bVar1) goto LAB_00543c46;
  }
  else {
LAB_00543c46:
    QVar4 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_38 = QVar4.yp;
    local_40 = QVar4.xp;
    local_28 = QPointF::toPoint((QPointF *)&local_40);
    iVar2 = QTreeViewPrivate::itemDecorationAt(this_00,&local_28);
    if (iVar2 == -1) {
      QAbstractItemView::mousePressEvent((QAbstractItemView *)this,event);
      goto LAB_00543ca2;
    }
  }
  local_40 = -NAN;
  local_38 = 0.0;
  tStack_30.ptr = (QAbstractItemModel *)0x0;
  QPersistentModelIndex::operator=
            (&(this_00->super_QAbstractItemViewPrivate).pressedIndex,(QModelIndex *)&local_40);
LAB_00543ca2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    bool handled = false;
    if (style()->styleHint(QStyle::SH_ListViewExpand_SelectMouseType, nullptr, this) == QEvent::MouseButtonPress)
        handled = d->expandOrCollapseItemAtPos(event->position().toPoint());
    if (!handled && d->itemDecorationAt(event->position().toPoint()) == -1)
        QAbstractItemView::mousePressEvent(event);
    else
        d->pressedIndex = QModelIndex();
}